

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O3

Reals Omega_h::repeat_symm<2>(LO n,Tensor<2> symm)

{
  undefined1 auVar1 [16];
  Vector<3> v;
  undefined4 in_register_0000003c;
  Reals RVar2;
  Reals RVar3;
  undefined8 uStack_10;
  
  RVar3.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar3.write_.shared_alloc_.alloc._0_4_ = n;
  auVar1._8_4_ = symm.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0].
                 _0_4_;
  auVar1._0_8_ = symm.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  auVar1._12_4_ =
       symm.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0]._4_4_;
  uStack_10 = auVar1._8_8_;
  v.super_Few<double,_3>.array_[1] =
       symm.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  v.super_Few<double,_3>.array_[0] =
       symm.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  v.super_Few<double,_3>.array_[2] = uStack_10;
  RVar2 = repeat_vector<3>(n,v);
  RVar3.write_.shared_alloc_.direct_ptr = RVar2.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals repeat_symm(LO const n, Tensor<dim> const symm) {
  return repeat_vector(n, symm2vector(symm));
}